

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_normal.cpp
# Opt level: O3

MPP_RET mpp_dec_control_normal(MppDecImpl *dec,MpiCmd cmd,void *param)

{
  pthread_mutex_t *__mutex;
  MPP_RET MVar1;
  uint in_EAX;
  ulong uStack_28;
  MPP_RET ret;
  
  uStack_28 = (ulong)in_EAX;
  __mutex = (pthread_mutex_t *)dec->cmd_lock;
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock(__mutex);
  }
  dec->cmd = cmd;
  dec->param = param;
  dec->cmd_ret = &ret;
  dec->cmd_send = dec->cmd_send + 1;
  if (((byte)mpp_dec_debug & 0x20) != 0) {
    _mpp_log_l(4,"mpp_dec","detail: %p control cmd %08x param %p start disable_thread %d \n",
               "mpp_dec_control_normal",dec,cmd,param,(ulong)(dec->cfg).base.disable_thread);
  }
  mpp_dec_notify_normal(dec,0x10000);
  sem_post((sem_t *)&dec->cmd_start);
  sem_wait((sem_t *)&dec->cmd_done);
  MVar1 = ret;
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock(__mutex);
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_dec_control_normal(MppDecImpl *dec, MpiCmd cmd, void *param)
{
    MPP_RET ret = MPP_OK;
    AutoMutex auto_lock(dec->cmd_lock->mutex());

    dec->cmd = cmd;
    dec->param = param;
    dec->cmd_ret = &ret;
    dec->cmd_send++;

    dec_dbg_detail("detail: %p control cmd %08x param %p start disable_thread %d \n",
                   dec, cmd, param, dec->cfg.base.disable_thread);

    mpp_dec_notify_normal(dec, MPP_DEC_CONTROL);
    sem_post(&dec->cmd_start);
    sem_wait(&dec->cmd_done);

    return ret;
}